

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O3

void __thiscall spdlog::logger::~logger(logger *this)

{
  ~logger(this);
  operator_delete(this,0xd0);
  return;
}

Assistant:

virtual ~logger() = default;